

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_enum.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  char cVar1;
  Context *context;
  EnumValueDescriptor *pEVar2;
  string *value1;
  ulong uVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  mapped_type *pmVar7;
  pointer ppEVar8;
  EnumDescriptor *pEVar9;
  long *plVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int iVar11;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int i;
  int i_00;
  char *pcVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar13;
  char *pcVar14;
  ulong uVar15;
  Printer *pPVar16;
  long lVar17;
  bool bVar18;
  string local_d0;
  Printer *local_b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_78;
  string index_text;
  
  WriteEnumDocComment(printer,this->descriptor_);
  context = this->context_;
  pEVar9 = this->descriptor_;
  bVar18 = this->immutable_api_;
  vars._M_t._M_impl._0_8_ = &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char_const*>((string *)&vars,"");
  MaybePrintGeneratedAnnotation<google::protobuf::EnumDescriptor_const>
            (context,printer,pEVar9,bVar18,(string *)&vars);
  if ((_Base_ptr *)vars._M_t._M_impl._0_8_ !=
      &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)vars._M_t._M_impl._0_8_,
                    (ulong)((long)&(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  io::Printer::Print(printer,
                     "public enum $classname$\n    implements com.google.protobuf.ProtocolMessageEnum {\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Annotate<google::protobuf::EnumDescriptor>
            (printer,"classname","classname",this->descriptor_);
  io::Printer::Indent(printer);
  index_text._M_dataplus._M_p = (pointer)&index_text.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&index_text,"ordinal()","");
  ppEVar8 = (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8;
  bVar18 = lVar5 == 0;
  local_b0 = printer;
  if (!bVar18) {
    uVar6 = lVar5 >> 3;
    if ((int)((ulong)((long)*ppEVar8 - *(long *)(*(long *)(*ppEVar8 + 0x18) + 0x30)) >> 3) *
        -0x33333333 == 0) {
      uVar3 = 1;
      do {
        uVar15 = uVar3;
        if (uVar6 + (uVar6 == 0) == uVar15) {
          bVar18 = uVar6 <= uVar15;
          goto LAB_00292020;
        }
        uVar3 = uVar15 + 1;
      } while (uVar15 == (uint)((int)((ulong)((long)ppEVar8[uVar15] -
                                             *(long *)(*(long *)(ppEVar8[uVar15] + 0x18) + 0x30)) >>
                                     3) * -0x33333333));
      bVar18 = uVar6 <= uVar15;
    }
    std::__cxx11::string::_M_replace
              ((ulong)&index_text,0,(char *)index_text._M_string_length,0x36667a);
  }
LAB_00292020:
  if ((this->canonical_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->canonical_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pcVar12 = "$name$($index$, $number$),\n";
    if (bVar18) {
      pcVar12 = "$name$($number$),\n";
    }
    uVar6 = 0;
    do {
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &vars._M_t._M_impl.super__Rb_tree_header._M_header;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&vars._M_t,&local_d0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      iVar11 = extraout_EDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        iVar11 = extraout_EDX_00;
      }
      pEVar2 = (this->canonical_values_).
               super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6];
      SimpleItoa_abi_cxx11_
                (&local_d0,
                 (protobuf *)
                 (ulong)(uint)((int)((ulong)((long)pEVar2 -
                                            *(long *)(*(long *)(pEVar2 + 0x18) + 0x30)) >> 3) *
                              -0x33333333),iVar11);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"index","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&vars._M_t,&local_78);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d0);
      iVar11 = extraout_EDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        iVar11 = extraout_EDX_02;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        iVar11 = extraout_EDX_03;
      }
      SimpleItoa_abi_cxx11_
                (&local_d0,
                 (protobuf *)
                 (ulong)*(uint *)((this->canonical_values_).
                                  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar6] + 0x10),iVar11);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"number","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&vars._M_t,&local_78);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      WriteEnumValueDocComment
                (local_b0,(this->canonical_values_).
                          super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar6]);
      if (*(char *)(*(long *)((this->canonical_values_).
                              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar6] + 0x20) + 0x68) ==
          '\x01') {
        io::Printer::Print(local_b0,"@java.lang.Deprecated\n");
      }
      io::Printer::Print(local_b0,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)&vars._M_t,pcVar12);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars._M_t);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (ulong)((long)(this->canonical_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->canonical_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pPVar16 = local_b0;
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
    pcVar12 = "UNRECOGNIZED(-1, -1),\n";
    if (bVar18) {
      pcVar12 = "UNRECOGNIZED(-1),\n";
    }
    io::Printer::Print(local_b0,pcVar12);
  }
  io::Printer::Print(pPVar16,";\n\n");
  if ((this->aliases_).
      super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->aliases_).
      super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &vars._M_t._M_impl.super__Rb_tree_header._M_header;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"classname","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&vars._M_t,&local_d0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&vars._M_t,&local_d0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"canonical_name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&vars._M_t,&local_d0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      pPVar16 = local_b0;
      WriteEnumValueDocComment
                (local_b0,*(EnumValueDescriptor **)
                           ((long)&((this->aliases_).
                                    super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->value + lVar5));
      io::Printer::Print(pPVar16,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&vars._M_t,
                         "public static final $classname$ $name$ = $canonical_name$;\n");
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars._M_t);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x10;
    } while (uVar6 < (ulong)((long)(this->aliases_).
                                   super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->aliases_).
                                   super__Vector_base<google::protobuf::compiler::java::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::java::EnumGenerator::Alias>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  }
  if (0 < *(int *)(this->descriptor_ + 0x2c)) {
    lVar17 = 0;
    lVar5 = 0;
    do {
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &vars._M_t._M_impl.super__Rb_tree_header._M_header;
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"name","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&vars._M_t,&local_d0);
      std::__cxx11::string::_M_assign((string *)pmVar7);
      iVar11 = extraout_EDX_04;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        iVar11 = extraout_EDX_05;
      }
      SimpleItoa_abi_cxx11_
                (&local_d0,
                 (protobuf *)(ulong)*(uint *)(*(long *)(this->descriptor_ + 0x30) + 0x10 + lVar17),
                 iVar11);
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"number","");
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&vars._M_t,&local_78);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      pPVar16 = local_b0;
      WriteEnumValueDocComment
                (local_b0,(EnumValueDescriptor *)(*(long *)(this->descriptor_ + 0x30) + lVar17));
      io::Printer::Print(pPVar16,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&vars._M_t,"public static final int $name$_VALUE = $number$;\n")
      ;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars._M_t);
      lVar5 = lVar5 + 1;
      lVar17 = lVar17 + 0x28;
    } while (lVar5 < *(int *)(this->descriptor_ + 0x2c));
  }
  pPVar16 = local_b0;
  io::Printer::Print(local_b0,"\n");
  io::Printer::Print(pPVar16,"\npublic final int getNumber() {\n");
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
    pcVar12 = 
    "  if (index == -1) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
    ;
    if (bVar18) {
      pcVar12 = 
      "  if (this == UNRECOGNIZED) {\n    throw new java.lang.IllegalArgumentException(\n        \"Can\'t get the number of an unknown enum value.\");\n  }\n"
      ;
    }
    io::Printer::Print(pPVar16,pcVar12);
  }
  io::Printer::Print(pPVar16,
                     "  return value;\n}\n\n/**\n * @deprecated Use {@link #forNumber(int)} instead.\n */\n@java.lang.Deprecated\npublic static $classname$ valueOf(int value) {\n  return forNumber(value);\n}\n\npublic static $classname$ forNumber(int value) {\n  switch (value) {\n"
                     ,"classname",*(string **)this->descriptor_);
  io::Printer::Indent(pPVar16);
  io::Printer::Indent(pPVar16);
  ppEVar8 = (this->canonical_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->canonical_values_).
      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppEVar8) {
    uVar6 = 0;
    uVar13 = extraout_RDX;
    do {
      value1 = *(string **)ppEVar8[uVar6];
      SimpleItoa_abi_cxx11_
                ((string *)&vars,(protobuf *)(ulong)*(uint *)(ppEVar8[uVar6] + 0x10),(int)uVar13);
      io::Printer::Print(local_b0,"case $number$: return $name$;\n","name",value1,"number",
                         (string *)&vars);
      uVar13 = extraout_RDX_00;
      if ((_Base_ptr *)vars._M_t._M_impl._0_8_ !=
          &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)vars._M_t._M_impl._0_8_,
                        (ulong)((long)&(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
        uVar13 = extraout_RDX_01;
      }
      uVar6 = uVar6 + 1;
      ppEVar8 = (this->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(this->canonical_values_).
                                   super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar8 >> 3))
    ;
  }
  pPVar16 = local_b0;
  io::Printer::Outdent(local_b0);
  io::Printer::Outdent(pPVar16);
  io::Printer::Print(pPVar16,
                     "    default: return null;\n  }\n}\n\npublic static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n    internalGetValueMap() {\n  return internalValueMap;\n}\nprivate static final com.google.protobuf.Internal.EnumLiteMap<\n    $classname$> internalValueMap =\n      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n        public $classname$ findValueByNumber(int number) {\n          return $classname$.forNumber(number);\n        }\n      };\n\n"
                     ,"classname",*(string **)this->descriptor_);
  if (((this->context_->options_).enforce_lite != false) ||
     (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 3))
  goto LAB_0029297e;
  io::Printer::Print(pPVar16,
                     "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n    getValueDescriptor() {\n  return getDescriptor().getValues().get($index_text$);\n}\npublic final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptorForType() {\n  return getDescriptor();\n}\npublic static final com.google.protobuf.Descriptors.EnumDescriptor\n    getDescriptor() {\n"
                     ,"index_text",&index_text);
  pEVar9 = this->descriptor_;
  if (*(long *)(pEVar9 + 0x18) == 0) {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&vars,this->name_resolver_,*(FileDescriptor **)(pEVar9 + 0x10),
               this->immutable_api_);
    pEVar9 = this->descriptor_;
    if (*(long *)(pEVar9 + 0x18) == 0) {
      plVar10 = (long *)(*(long *)(pEVar9 + 0x10) + 0x70);
    }
    else {
      plVar10 = (long *)(*(long *)(pEVar9 + 0x18) + 0x60);
    }
    SimpleItoa_abi_cxx11_
              (&local_d0,
               (protobuf *)(ulong)(uint)((int)((ulong)((long)pEVar9 - *plVar10) >> 3) * -0x49249249)
               ,i_00);
    io::Printer::Print(pPVar16,"  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
                       "file",(string *)&vars,"index",&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) goto LAB_00292858;
  }
  else {
    ClassNameResolver::GetClassName_abi_cxx11_
              ((string *)&vars,this->name_resolver_,*(Descriptor **)(pEVar9 + 0x18),
               this->immutable_api_);
    cVar1 = *(char *)(*(long *)(*(long *)(this->descriptor_ + 0x18) + 0x20) + 0x69);
    pcVar12 = "getDescriptor()";
    if (cVar1 != '\0') {
      pcVar12 = "getDefaultInstance().getDescriptorForType()";
    }
    pcVar14 = pcVar12 + 0xf;
    if (cVar1 != '\0') {
      pcVar14 = pcVar12 + 0x2b;
    }
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,pcVar12,pcVar14);
    pEVar9 = this->descriptor_;
    if (*(long *)(pEVar9 + 0x18) == 0) {
      plVar10 = (long *)(*(long *)(pEVar9 + 0x10) + 0x70);
    }
    else {
      plVar10 = (long *)(*(long *)(pEVar9 + 0x18) + 0x60);
    }
    SimpleItoa_abi_cxx11_
              (&local_78,
               (protobuf *)(ulong)(uint)((int)((ulong)((long)pEVar9 - *plVar10) >> 3) * -0x49249249)
               ,i);
    io::Printer::Print(pPVar16,"  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
                       "parent",(string *)&vars,"descriptor",&local_d0,"index",&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
LAB_00292858:
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((_Base_ptr *)vars._M_t._M_impl._0_8_ !=
      &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)vars._M_t._M_impl._0_8_,
                    (ulong)((long)&(vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  io::Printer::Print(pPVar16,"}\n\nprivate static final $classname$[] VALUES = ","classname",
                     *(string **)this->descriptor_);
  bVar4 = CanUseEnumValues(this);
  if (bVar4) {
    pcVar12 = "values();\n";
  }
  else {
    io::Printer::Print(pPVar16,"{\n  ");
    pEVar9 = this->descriptor_;
    pcVar12 = "\n};\n";
    if (0 < *(int *)(pEVar9 + 0x2c)) {
      lVar5 = 0;
      lVar17 = 0;
      do {
        io::Printer::Print(local_b0,"$name$, ","name",*(string **)(*(long *)(pEVar9 + 0x30) + lVar5)
                          );
        lVar17 = lVar17 + 1;
        pEVar9 = this->descriptor_;
        lVar5 = lVar5 + 0x28;
        pPVar16 = local_b0;
      } while (lVar17 < *(int *)(pEVar9 + 0x2c));
    }
  }
  io::Printer::Print(pPVar16,pcVar12);
  io::Printer::Print(pPVar16,
                     "\npublic static $classname$ valueOf(\n    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n  if (desc.getType() != getDescriptor()) {\n    throw new java.lang.IllegalArgumentException(\n      \"EnumValueDescriptor is not for this type.\");\n  }\n"
                     ,"classname",*(string **)this->descriptor_);
  if (*(int *)(*(long *)(this->descriptor_ + 0x10) + 0x8c) == 3) {
    io::Printer::Print(pPVar16,"  if (desc.getIndex() == -1) {\n    return UNRECOGNIZED;\n  }\n");
  }
  io::Printer::Print(pPVar16,"  return VALUES[desc.getIndex()];\n}\n\n");
  if (!bVar18) {
    io::Printer::Print(pPVar16,"private final int index;\n");
  }
LAB_0029297e:
  io::Printer::Print(pPVar16,"private final int value;\n\n");
  pcVar12 = "private $classname$(int index, int value) {\n";
  if (bVar18) {
    pcVar12 = "private $classname$(int value) {\n";
  }
  io::Printer::Print(pPVar16,pcVar12,"classname",*(string **)this->descriptor_);
  bVar4 = true;
  if ((this->context_->options_).enforce_lite == false) {
    bVar4 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0xa0) + 0xa8) == 3;
  }
  if (!bVar18 && !bVar4) {
    io::Printer::Print(pPVar16,"  this.index = index;\n");
  }
  io::Printer::Print(pPVar16,"  this.value = value;\n}\n");
  io::Printer::Print(pPVar16,"\n// @@protoc_insertion_point(enum_scope:$full_name$)\n","full_name",
                     *(string **)(this->descriptor_ + 8));
  io::Printer::Outdent(pPVar16);
  io::Printer::Print(pPVar16,"}\n\n");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)index_text._M_dataplus._M_p != &index_text.field_2) {
    operator_delete(index_text._M_dataplus._M_p,index_text.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  WriteEnumDocComment(printer, descriptor_);
  MaybePrintGeneratedAnnotation(context_, printer, descriptor_, immutable_api_);
  printer->Print(
      "public enum $classname$\n"
      "    implements com.google.protobuf.ProtocolMessageEnum {\n",
      "classname", descriptor_->name());
  printer->Annotate("classname", descriptor_);
  printer->Indent();

  bool ordinal_is_index = true;
  string index_text = "ordinal()";
  for (int i = 0; i < canonical_values_.size(); i++) {
    if (canonical_values_[i]->index() != i) {
      ordinal_is_index = false;
      index_text = "index";
      break;
    }
  }

  for (int i = 0; i < canonical_values_.size(); i++) {
    std::map<string, string> vars;
    vars["name"] = canonical_values_[i]->name();
    vars["index"] = SimpleItoa(canonical_values_[i]->index());
    vars["number"] = SimpleItoa(canonical_values_[i]->number());
    WriteEnumValueDocComment(printer, canonical_values_[i]);
    if (canonical_values_[i]->options().deprecated()) {
      printer->Print("@java.lang.Deprecated\n");
    }
    if (ordinal_is_index) {
      printer->Print(vars,
        "$name$($number$),\n");
    } else {
      printer->Print(vars,
        "$name$($index$, $number$),\n");
    }
  }

  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print("UNRECOGNIZED(-1),\n");
    } else {
      printer->Print("UNRECOGNIZED(-1, -1),\n");
    }
  }

  printer->Print(
    ";\n"
    "\n");

  // -----------------------------------------------------------------

  for (int i = 0; i < aliases_.size(); i++) {
    std::map<string, string> vars;
    vars["classname"] = descriptor_->name();
    vars["name"] = aliases_[i].value->name();
    vars["canonical_name"] = aliases_[i].canonical_value->name();
    WriteEnumValueDocComment(printer, aliases_[i].value);
    printer->Print(vars,
      "public static final $classname$ $name$ = $canonical_name$;\n");
  }

  for (int i = 0; i < descriptor_->value_count(); i++) {
    std::map<string, string> vars;
    vars["name"] = descriptor_->value(i)->name();
    vars["number"] = SimpleItoa(descriptor_->value(i)->number());
    WriteEnumValueDocComment(printer, descriptor_->value(i));
    printer->Print(vars,
      "public static final int $name$_VALUE = $number$;\n");
  }
  printer->Print("\n");

  // -----------------------------------------------------------------

  printer->Print(
    "\n"
    "public final int getNumber() {\n");
  if (SupportUnknownEnumValue(descriptor_->file())) {
    if (ordinal_is_index) {
      printer->Print(
        "  if (this == UNRECOGNIZED) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
    } else {
      printer->Print(
        "  if (index == -1) {\n"
        "    throw new java.lang.IllegalArgumentException(\n"
        "        \"Can't get the number of an unknown enum value.\");\n"
        "  }\n");
    }
  }
  printer->Print(
    "  return value;\n"
    "}\n"
    "\n"
    "/**\n"
    " * @deprecated Use {@link #forNumber(int)} instead.\n"
    " */\n"
    "@java.lang.Deprecated\n"
    "public static $classname$ valueOf(int value) {\n"
    "  return forNumber(value);\n"
    "}\n"
    "\n"
    "public static $classname$ forNumber(int value) {\n"
    "  switch (value) {\n",
    "classname", descriptor_->name());
  printer->Indent();
  printer->Indent();

  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print(
      "case $number$: return $name$;\n",
      "name", canonical_values_[i]->name(),
      "number", SimpleItoa(canonical_values_[i]->number()));
  }

  printer->Outdent();
  printer->Outdent();
  printer->Print(
    "    default: return null;\n"
    "  }\n"
    "}\n"
    "\n"
    "public static com.google.protobuf.Internal.EnumLiteMap<$classname$>\n"
    "    internalGetValueMap() {\n"
    "  return internalValueMap;\n"
    "}\n"
    "private static final com.google.protobuf.Internal.EnumLiteMap<\n"
    "    $classname$> internalValueMap =\n"
    "      new com.google.protobuf.Internal.EnumLiteMap<$classname$>() {\n"
    "        public $classname$ findValueByNumber(int number) {\n"
    "          return $classname$.forNumber(number);\n"
    "        }\n"
    "      };\n"
    "\n",
    "classname", descriptor_->name());

  // -----------------------------------------------------------------
  // Reflection

  if (HasDescriptorMethods(descriptor_, context_->EnforceLite())) {
    printer->Print(
      "public final com.google.protobuf.Descriptors.EnumValueDescriptor\n"
      "    getValueDescriptor() {\n"
      "  return getDescriptor().getValues().get($index_text$);\n"
      "}\n"
      "public final com.google.protobuf.Descriptors.EnumDescriptor\n"
      "    getDescriptorForType() {\n"
      "  return getDescriptor();\n"
      "}\n"
      "public static final com.google.protobuf.Descriptors.EnumDescriptor\n"
      "    getDescriptor() {\n",
      "index_text", index_text);

    // TODO(kenton):  Cache statically?  Note that we can't access descriptors
    //   at module init time because it wouldn't work with descriptor.proto, but
    //   we can cache the value the first time getDescriptor() is called.
    if (descriptor_->containing_type() == NULL) {
      // The class generated for the File fully populates the descriptor with
      // extensions in both the mutable and immutable cases. (In the mutable api
      // this is accomplished by attempting to load the immutable outer class).
      printer->Print(
        "  return $file$.getDescriptor().getEnumTypes().get($index$);\n",
        "file", name_resolver_->GetClassName(descriptor_->file(),
                                             immutable_api_),
        "index", SimpleItoa(descriptor_->index()));
    } else {
      printer->Print(
          "  return $parent$.$descriptor$.getEnumTypes().get($index$);\n",
          "parent", name_resolver_->GetClassName(descriptor_->containing_type(),
                                                 immutable_api_),
          "descriptor", descriptor_->containing_type()->options()
                        .no_standard_descriptor_accessor()
                        ? "getDefaultInstance().getDescriptorForType()"
                        : "getDescriptor()",
          "index", SimpleItoa(descriptor_->index()));
    }

    printer->Print(
      "}\n"
      "\n"
      "private static final $classname$[] VALUES = ",
      "classname", descriptor_->name());

    if (CanUseEnumValues()) {
      // If the constants we are going to output are exactly the ones we
      // have declared in the Java enum in the same order, then we can use
      // the values() method that the Java compiler automatically generates
      // for every enum.
      printer->Print("values();\n");
    } else {
      printer->Print(
        "{\n"
        "  ");
      for (int i = 0; i < descriptor_->value_count(); i++) {
        printer->Print("$name$, ",
          "name", descriptor_->value(i)->name());
      }
      printer->Print(
          "\n"
          "};\n");
    }

    printer->Print(
      "\n"
      "public static $classname$ valueOf(\n"
      "    com.google.protobuf.Descriptors.EnumValueDescriptor desc) {\n"
      "  if (desc.getType() != getDescriptor()) {\n"
      "    throw new java.lang.IllegalArgumentException(\n"
      "      \"EnumValueDescriptor is not for this type.\");\n"
      "  }\n",
      "classname", descriptor_->name());
    if (SupportUnknownEnumValue(descriptor_->file())) {
      printer->Print(
        "  if (desc.getIndex() == -1) {\n"
        "    return UNRECOGNIZED;\n"
        "  }\n");
    }
    printer->Print(
      "  return VALUES[desc.getIndex()];\n"
      "}\n"
      "\n");

    if (!ordinal_is_index) {
      printer->Print("private final int index;\n");
    }
  }

  // -----------------------------------------------------------------

  printer->Print(
    "private final int value;\n\n");

  if (ordinal_is_index) {
    printer->Print(
      "private $classname$(int value) {\n",
      "classname", descriptor_->name());
  } else {
    printer->Print(
      "private $classname$(int index, int value) {\n",
      "classname", descriptor_->name());
  }
  if (HasDescriptorMethods(descriptor_, context_->EnforceLite()) &&
      !ordinal_is_index) {
    printer->Print("  this.index = index;\n");
  }
  printer->Print(
    "  this.value = value;\n"
    "}\n");

  printer->Print(
    "\n"
    "// @@protoc_insertion_point(enum_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n\n");
}